

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * Curl_hash_add2(Curl_hash *h,void *key,size_t key_len,void *p,Curl_hash_elem_dtor dtor)

{
  Curl_llist *pCVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  Curl_hash_element *ne;
  ulong local_58;
  size_t i;
  Curl_llist *l;
  Curl_llist_node *le;
  Curl_hash_element *he;
  Curl_hash_elem_dtor dtor_local;
  void *p_local;
  size_t key_len_local;
  void *key_local;
  Curl_hash *h_local;
  
  if (h->table == (Curl_llist *)0x0) {
    pCVar1 = (Curl_llist *)(*Curl_cmalloc)(h->slots << 5);
    h->table = pCVar1;
    if (h->table == (Curl_llist *)0x0) {
      return (void *)0x0;
    }
    for (local_58 = 0; local_58 < h->slots; local_58 = local_58 + 1) {
      Curl_llist_init(h->table + local_58,hash_element_dtor);
    }
  }
  pCVar1 = h->table;
  sVar2 = (*h->hash_func)(key,key_len,h->slots);
  l = (Curl_llist *)Curl_llist_head(pCVar1 + sVar2);
  do {
    if (l == (Curl_llist *)0x0) {
LAB_001450cd:
      ne = mk_hash_element(key,key_len,p,dtor);
      if (ne == (Curl_hash_element *)0x0) {
        h_local = (Curl_hash *)0x0;
      }
      else {
        Curl_llist_append(pCVar1 + sVar2,ne,&ne->list);
        h->size = h->size + 1;
        h_local = (Curl_hash *)p;
      }
      return h_local;
    }
    pvVar3 = Curl_node_elem((Curl_llist_node *)l);
    sVar4 = (*h->comp_func)((void *)((long)pvVar3 + 0x38),*(size_t *)((long)pvVar3 + 0x30),key,
                            key_len);
    if (sVar4 != 0) {
      Curl_node_uremove((Curl_llist_node *)l,h);
      h->size = h->size - 1;
      goto LAB_001450cd;
    }
    l = (Curl_llist *)Curl_node_next((Curl_llist_node *)l);
  } while( true );
}

Assistant:

void *Curl_hash_add2(struct Curl_hash *h, void *key, size_t key_len, void *p,
                     Curl_hash_elem_dtor dtor)
{
  struct Curl_hash_element  *he;
  struct Curl_llist_node *le;
  struct Curl_llist *l;

  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(!h->table) {
    size_t i;
    h->table = malloc(h->slots * sizeof(struct Curl_llist));
    if(!h->table)
      return NULL; /* OOM */
    for(i = 0; i < h->slots; ++i)
      Curl_llist_init(&h->table[i], hash_element_dtor);
  }

  l = FETCH_LIST(h, key, key_len);

  for(le = Curl_llist_head(l); le; le = Curl_node_next(le)) {
    he = (struct Curl_hash_element *) Curl_node_elem(le);
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_node_uremove(le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p, dtor);
  if(he) {
    Curl_llist_append(l, he, &he->list);
    ++h->size;
    return p; /* return the new entry */
  }

  return NULL; /* failure */
}